

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O2

string * __thiscall
solitaire::cards::to_string_abi_cxx11_(string *__return_storage_ptr__,cards *this,Value *value)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(*(undefined4 *)this) {
  case 0:
    __s = "Ace";
    __a = &local_9;
    break;
  case 1:
    __s = "Two";
    __a = &local_a;
    break;
  case 2:
    __s = "Three";
    __a = &local_b;
    break;
  case 3:
    __s = "Four";
    __a = &local_c;
    break;
  case 4:
    __s = "Five";
    __a = &local_d;
    break;
  case 5:
    __s = "Six";
    __a = &local_e;
    break;
  case 6:
    __s = "Seven";
    __a = &local_f;
    break;
  case 7:
    __s = "Eight";
    __a = &local_10;
    break;
  case 8:
    __s = "Nine";
    __a = &local_11;
    break;
  case 9:
    __s = "Ten";
    __a = &local_12;
    break;
  case 10:
    __s = "Jack";
    __a = &local_13;
    break;
  case 0xb:
    __s = "Queen";
    __a = &local_14;
    break;
  case 0xc:
    __s = "King";
    __a = &local_15;
    break;
  default:
    __s = "Unknown";
    __a = &local_16;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const Value& value) {
    switch(value) {
        case Value::Ace:
            return "Ace";
        case Value::Two:
            return "Two";
        case Value::Three:
            return "Three";
        case Value::Four:
            return "Four";
        case Value::Five:
            return "Five";
        case Value::Six:
            return "Six";
        case Value::Seven:
            return "Seven";
        case Value::Eight:
            return "Eight";
        case Value::Nine:
            return "Nine";
        case Value::Ten:
            return "Ten";
        case Value::Jack:
            return "Jack";
        case Value::Queen:
            return "Queen";
        case Value::King:
            return "King";
        default:
            return "Unknown";
    }
}